

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall TArray<VMValue,_VMValue>::Push(TArray<VMValue,_VMValue> *this,VMValue *item)

{
  uint uVar1;
  VMValue *pVVar2;
  undefined8 uVar3;
  
  Grow(this,1);
  pVVar2 = this->Array;
  uVar1 = this->Count;
  uVar3 = *(undefined8 *)((long)&item->field_0 + 8);
  pVVar2[uVar1].field_0.field_1.a = (item->field_0).field_1.a;
  *(undefined8 *)((long)&pVVar2[uVar1].field_0 + 8) = uVar3;
  if (pVVar2[uVar1].field_0.field_3.Type == '\x02') {
    FString::AttachToOther((FString *)(pVVar2 + uVar1),(FString *)item);
  }
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}